

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

int __thiscall QCssScanner_Generated::handleCommentStart(QCssScanner_Generated *this)

{
  char16_t *pcVar1;
  long lVar2;
  long lVar3;
  
  pcVar1 = (this->input).d.ptr;
  lVar2 = (this->input).d.size;
  lVar3 = this->pos;
  while( true ) {
    if (lVar2 + -1 <= lVar3) {
      return 1;
    }
    if ((pcVar1[lVar3] == L'*') && (pcVar1[lVar3 + 1] == L'/')) break;
    lVar3 = lVar3 + 1;
    this->pos = lVar3;
  }
  this->pos = lVar3 + 2;
  return 1;
}

Assistant:

int QCssScanner_Generated::handleCommentStart()
{
    while (pos < input.size() - 1) {
        if (input.at(pos) == u'*' && input.at(pos + 1) == u'/') {
            pos += 2;
            break;
        }
        ++pos;
    }
    return S;
}